

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall
VulkanHppGenerator::addMissingFlagBits
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *requiredBy)

{
  _Base_ptr p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pNVar4;
  _Base_ptr p_Var5;
  _Base_ptr __n;
  EnumData *pEVar6;
  int iVar7;
  iterator iVar8;
  size_type sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  iterator iVar11;
  const_iterator cVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  NameLine *type;
  pointer pNVar14;
  pointer pRVar15;
  undefined8 uVar16;
  bool bVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string flagBits;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> newTypes;
  allocator_type local_22a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  _Base_ptr local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
  *local_1e0;
  pointer local_1d8;
  _Base_ptr local_1d0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
  *local_1c8;
  pointer local_1c0;
  EnumData local_1b8;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
  local_110;
  pointer local_60;
  string *local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
  *local_40;
  pointer local_38;
  
  local_1d8 = (requireData->
              super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d8 != local_60) {
    local_40 = &this->m_bitmasks;
    local_48 = &(this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header;
    paVar2 = &local_110.first.field_2;
    local_1c8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
                 *)&this->m_enums;
    local_50 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
                 *)&this->m_types;
    local_1d0 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = requiredBy;
    do {
      local_128.
      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar14 = (local_1d8->types).
                super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (local_1d8->types).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pNVar14 != local_38) {
        do {
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
                  ::find(&local_40->_M_t,&pNVar14->name);
          if (iVar8._M_node != local_48) {
            pRVar15 = local_1d8;
            local_208 = iVar8._M_node;
            local_1c0 = pNVar14;
            if (iVar8._M_node[3]._M_right == (_Base_ptr)0x0) {
              p_Var1 = iVar8._M_node + 1;
              sVar9 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var1,"Flags",0,5);
              if (sVar9 == 0xffffffffffffffff) {
                __assert_fail("pos != std::string::npos",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x259,
                              "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                             );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1,0,
                     sVar9 + 4);
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_1b8,"Bit");
              local_110.first._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
              paVar13 = &pbVar10->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.first._M_dataplus._M_p == paVar13) {
                local_110.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_110.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                local_110.first._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_110.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              }
              local_110.first._M_string_length = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1,
                     sVar9 + 4,0xffffffffffffffff);
              pRVar15 = local_1d8;
              uVar16 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.first._M_dataplus._M_p != paVar2) {
                uVar16 = local_110.first.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar16 < local_228._M_string_length + local_110.first._M_string_length) {
                uVar16 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  uVar16 = local_228.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar16 < local_228._M_string_length + local_110.first._M_string_length)
                goto LAB_0010bef0;
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&local_228,0,0,local_110.first._M_dataplus._M_p,
                                     local_110.first._M_string_length);
              }
              else {
LAB_0010bef0:
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&local_110.first,local_228._M_dataplus._M_p,
                                    local_228._M_string_length);
              }
              local_200._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
              paVar13 = &pbVar10->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p == paVar13) {
                local_200.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              }
              else {
                local_200.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              }
              local_200._M_string_length = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar10->_M_string_length = 0;
              paVar13->_M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                local_228.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.first._M_dataplus._M_p != paVar2) {
                operator_delete(local_110.first._M_dataplus._M_p,
                                local_110.first.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)local_1b8.aliases._M_t._M_impl._0_8_ !=
                  (_Base_ptr *)((long)&local_1b8.aliases._M_t._M_impl.super__Rb_tree_header + 8U)) {
                operator_delete((void *)local_1b8.aliases._M_t._M_impl._0_8_,
                                (ulong)((long)&(local_1b8.aliases._M_t._M_impl.super__Rb_tree_header
                                                ._M_header._M_parent)->_M_color + 1));
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_208[3]._M_left,&local_200);
              iVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                               *)local_1c8,&local_200);
              if (iVar11._M_node == local_50) {
                local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                local_1b8.aliases._M_t._M_impl._0_8_ = 0;
                local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header;
                local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1b8.bitwidth._M_dataplus._M_p = (pointer)&local_1b8.bitwidth.field_2;
                local_1b8.bitwidth._M_string_length = 0;
                local_1b8.bitwidth.field_2._M_local_buf[0] = '\0';
                local_1b8.isBitmask = true;
                local_1b8.values.
                super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1b8.values.
                super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_1b8.valueAliases.
                super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_1b8.values.
                super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1b8.valueAliases.
                super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1b8.valueAliases.
                super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1b8.xmlLine = 0;
                local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_VulkanHppGenerator::EnumData,_true>
                          (&local_110,&local_200,&local_1b8);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>
                          (local_1c8,&local_110);
                std::
                vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ::~vector(&local_110.second.values);
                std::
                vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ::~vector(&local_110.second.valueAliases);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110.second.bitwidth._M_dataplus._M_p !=
                    &local_110.second.bitwidth.field_2) {
                  operator_delete(local_110.second.bitwidth._M_dataplus._M_p,
                                  local_110.second.bitwidth.field_2._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_110.second);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110.first._M_dataplus._M_p != paVar2) {
                  operator_delete(local_110.first._M_dataplus._M_p,
                                  local_110.first.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ::~vector(&local_1b8.values);
                std::
                vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ::~vector(&local_1b8.valueAliases);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.bitwidth._M_dataplus._M_p != &local_1b8.bitwidth.field_2) {
                  operator_delete(local_1b8.bitwidth._M_dataplus._M_p,
                                  CONCAT71(local_1b8.bitwidth.field_2._M_allocated_capacity._1_7_,
                                           local_1b8.bitwidth.field_2._M_local_buf[0]) + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_1b8);
                cVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                 *)local_1e0,&local_200);
                if (cVar12._M_node != local_1d0) {
                  __assert_fail("!m_types.contains( flagBits )",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x265,
                                "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                               );
                }
                local_1b8.aliases._M_t._M_impl._0_8_ =
                     local_1b8.aliases._M_t._M_impl._0_8_ & 0xffffffff00000000;
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                pcVar3 = (local_58->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_228,pcVar3,pcVar3 + local_58->_M_string_length);
                __l._M_len = 1;
                __l._M_array = &local_228;
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1b8.aliases._M_t._M_impl.super__Rb_tree_header,__l,&local_229,
                      &local_22a);
                local_1b8.bitwidth._M_string_length =
                     local_1b8.bitwidth._M_string_length & 0xffffffff00000000;
                local_110.first._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,local_200._M_dataplus._M_p,
                           local_200._M_dataplus._M_p + local_200._M_string_length);
                local_110.second.aliases._M_t._M_impl._0_4_ = local_1b8.aliases._M_t._M_impl._0_4_;
                if (local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                    (_Base_ptr)0x0) {
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                  _0_4_ = 0;
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)0x0;
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)
                       ((long)&local_110.second.aliases._M_t._M_impl.super__Rb_tree_header + 8);
                  pEVar6 = &local_110.second;
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header
                               ._M_right;
                }
                else {
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                  _0_4_ = local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                          _0_4_;
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  local_110.second.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  (local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                  _M_parent = (_Base_ptr)
                              ((long)&local_110.second.aliases._M_t._M_impl.super__Rb_tree_header +
                              8);
                  local_110.second.bitwidth._M_dataplus._M_p = local_1b8.bitwidth._M_dataplus._M_p;
                  local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)0x0;
                  local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)((long)&local_1b8.aliases._M_t._M_impl.super__Rb_tree_header + 8);
                  pEVar6 = &local_1b8;
                  local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)local_1b8.aliases._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_right;
                }
                (pEVar6->bitwidth)._M_dataplus._M_p = (pointer)0x0;
                local_110.second.bitwidth._M_string_length._0_4_ =
                     (undefined4)local_1b8.bitwidth._M_string_length;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
                ::_M_insert_unique<std::pair<std::__cxx11::string_const,TypeData>>
                          (local_1e0,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
                            *)&local_110);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_110.second.aliases._M_t._M_impl.super__Rb_tree_header);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110.first._M_dataplus._M_p != paVar2) {
                  operator_delete(local_110.first._M_dataplus._M_p,
                                  local_110.first.field_2._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1b8.aliases._M_t._M_impl.super__Rb_tree_header);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                cVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                 *)local_1e0,&local_200);
                if (cVar12._M_node == local_1d0) {
                  __assert_fail("m_types.contains( flagBits )",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x26a,
                                "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                               );
                }
                *(undefined1 *)&iVar11._M_node[4]._M_left = 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
            }
            pNVar14 = (pRVar15->types).
                      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pNVar4 = (pRVar15->types).
                     super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar17 = pNVar14 == pNVar4;
            if (!bVar17) {
              p_Var5 = local_208[3]._M_right;
              bVar17 = false;
              do {
                __n = (_Base_ptr)(pNVar14->name)._M_string_length;
                if (__n == p_Var5) {
                  if (__n == (_Base_ptr)0x0) break;
                  iVar7 = bcmp((pNVar14->name)._M_dataplus._M_p,local_208[3]._M_left,(size_t)__n);
                  if (iVar7 == 0) break;
                }
                pNVar14 = pNVar14 + 1;
                bVar17 = pNVar14 == pNVar4;
              } while (!bVar17);
            }
            p_Var1 = local_208;
            pNVar14 = local_1c0;
            if (bVar17) {
              local_110.first._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,local_208[3]._M_left,
                         (long)&(local_208[3]._M_left)->_M_color +
                         (long)&(local_208[3]._M_right)->_M_color);
              local_110.second.aliases._M_t._M_impl._0_4_ = *(undefined4 *)&p_Var1[5]._M_left;
              std::
              vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
              emplace_back<VulkanHppGenerator::NameLine>(&local_128,(NameLine *)&local_110);
              pNVar14 = local_1c0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.first._M_dataplus._M_p != paVar2) {
                operator_delete(local_110.first._M_dataplus._M_p,
                                local_110.first.field_2._M_allocated_capacity + 1);
              }
            }
          }
          pNVar14 = pNVar14 + 1;
        } while (pNVar14 != local_38);
      }
      pRVar15 = local_1d8;
      std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<VulkanHppGenerator::NameLine*,std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>>>
                ((vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>
                  *)&local_1d8->types,
                 (local_1d8->types).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_128.
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_128.
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
      ~vector(&local_128);
      local_1d8 = pRVar15 + 1;
    } while (local_1d8 != local_60);
  }
  return;
}

Assistant:

void VulkanHppGenerator::addMissingFlagBits( std::vector<RequireData> & requireData, std::string const & requiredBy )
{
  for ( auto & require : requireData )
  {
    std::vector<NameLine> newTypes;
    for ( auto const & type : require.types )
    {
      auto bitmaskIt = m_bitmasks.find( type.name );
      if ( bitmaskIt != m_bitmasks.end() )
      {
        if ( bitmaskIt->second.require.empty() )
        {
          // generate the flagBits enum name out of the bitmask name: VkFooFlagsXXX -> VkFooFlagBitsXXX
          const size_t pos = bitmaskIt->first.find( "Flags" );
          assert( pos != std::string::npos );
          std::string flagBits = bitmaskIt->first.substr( 0, pos + 4 ) + "Bit" + bitmaskIt->first.substr( pos + 4 );

          bitmaskIt->second.require = flagBits;

          // some flagsBits are specified but never listed as required for any flags!
          // so, even if this bitmask has no enum listed as required, it might still already exist in the enums list
          auto enumIt = m_enums.find( flagBits );
          if ( enumIt == m_enums.end() )
          {
            m_enums.insert( { flagBits, EnumData{ .isBitmask = true, .xmlLine = 0 } } );

            assert( !m_types.contains( flagBits ) );
            m_types.insert( { flagBits, TypeData{ TypeCategory::Bitmask, { requiredBy }, 0 } } );
          }
          else
          {
            assert( m_types.contains( flagBits ) );
            enumIt->second.isBitmask = true;
          }
        }
        if ( std::ranges::none_of( require.types, [bitmaskIt]( auto const & requireType ) { return requireType.name == bitmaskIt->second.require; } ) )
        {
          // this bitmask requires a flags type that is not listed in here, so add it
          newTypes.push_back( { bitmaskIt->second.require, bitmaskIt->second.xmlLine } );
        }
      }
    }
    // add all the newly created flagBits types to the require list as if they had been part of the vk.xml!
    require.types.insert( require.types.end(), newTypes.begin(), newTypes.end() );
  }
}